

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalNinjaGenerator::GetLinkDependencyFile
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmGeneratorTarget *target,
          string *config)

{
  cmGlobalGenerator *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_38,target);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  (*pcVar1->_vptr_cmGlobalGenerator[0x4d])(&bStack_58,pcVar1,config);
  cmStrCat<std::__cxx11::string,std::__cxx11::string,char_const(&)[8]>
            (__return_storage_ptr__,&local_38,&bStack_58,(char (*) [8])"/link.d");
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::GetLinkDependencyFile(
  cmGeneratorTarget* target, std::string const& config) const
{
  return cmStrCat(target->GetSupportDirectory(),
                  this->GetGlobalNinjaGenerator()->ConfigDirectory(config),
                  "/link.d");
}